

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O3

void draw_quad(GLuint texture)

{
  GLFWwindow *handle;
  int height;
  int width;
  GLsizei local_20;
  GLsizei local_1c;
  
  handle = glfwGetCurrentContext();
  glfwGetFramebufferSize(handle,&local_1c,&local_20);
  (*glad_glViewport)(0,0,local_1c,local_20);
  (*glad_glMatrixMode)(0x1701);
  (*glad_glLoadIdentity)();
  (*glad_glOrtho)(0.0,1.0,0.0,1.0,0.0,1.0);
  (*glad_glEnable)(0xde1);
  (*glad_glBindTexture)(0xde1,texture);
  (*glad_glTexEnvi)(0x2300,0x2200,0x2100);
  (*glad_glBegin)(7);
  (*glad_glTexCoord2f)(0.0,0.0);
  (*glad_glVertex2f)(0.0,0.0);
  (*glad_glTexCoord2f)(1.0,0.0);
  (*glad_glVertex2f)(1.0,0.0);
  (*glad_glTexCoord2f)(1.0,1.0);
  (*glad_glVertex2f)(1.0,1.0);
  (*glad_glTexCoord2f)(0.0,1.0);
  (*glad_glVertex2f)(0.0,1.0);
  (*glad_glEnd)();
  return;
}

Assistant:

static void draw_quad(GLuint texture)
{
    int width, height;
    glfwGetFramebufferSize(glfwGetCurrentContext(), &width, &height);

    glViewport(0, 0, width, height);

    glMatrixMode(GL_PROJECTION);
    glLoadIdentity();
    glOrtho(0.f, 1.f, 0.f, 1.f, 0.f, 1.f);

    glEnable(GL_TEXTURE_2D);
    glBindTexture(GL_TEXTURE_2D, texture);
    glTexEnvi(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, GL_MODULATE);

    glBegin(GL_QUADS);

    glTexCoord2f(0.f, 0.f);
    glVertex2f(0.f, 0.f);

    glTexCoord2f(1.f, 0.f);
    glVertex2f(1.f, 0.f);

    glTexCoord2f(1.f, 1.f);
    glVertex2f(1.f, 1.f);

    glTexCoord2f(0.f, 1.f);
    glVertex2f(0.f, 1.f);

    glEnd();
}